

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

void __thiscall rw::Geometry::removeUnusedMaterials(Geometry *this)

{
  uint32 uVar1;
  int iVar2;
  MeshHeader *pMVar3;
  Material *pMVar4;
  undefined8 uVar5;
  Triangle *pTVar6;
  ushort uVar7;
  Material **ppMVar8;
  MeshHeader *pMVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int32 numMeshes;
  MeshHeader *pMVar13;
  long lVar14;
  long lVar15;
  MeshHeader *pMVar16;
  long lVar17;
  
  pMVar3 = this->meshHeader;
  if (pMVar3 == (MeshHeader *)0x0) {
    return;
  }
  if (pMVar3->numMeshes != 0) {
    lVar10 = 0;
    do {
      if (*(long *)((long)&pMVar3[1].flags + lVar10) == 0) {
        return;
      }
      lVar10 = lVar10 + 0x18;
    } while ((ulong)pMVar3->numMeshes * 0x18 != lVar10);
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 635"
  ;
  lVar10 = (*DAT_0014ada8)((long)(this->matList).numMaterials << 2,0x1000f);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 637"
  ;
  ppMVar8 = (Material **)(*DAT_0014ada8)((long)(this->matList).numMaterials << 3,0x30007);
  uVar7 = pMVar3->numMeshes;
  if ((ulong)uVar7 == 0) {
    numMeshes = 0;
  }
  else {
    uVar11 = 0;
    numMeshes = 0;
    do {
      if (*(int *)((long)pMVar3 + uVar11 * 0x18 + 0x18) != 0) {
        pMVar4 = *(Material **)((long)pMVar3 + uVar11 * 0x18 + 0x20);
        ppMVar8[numMeshes] = pMVar4;
        pMVar4->refCount = pMVar4->refCount + 1;
        lVar14 = (long)(this->matList).numMaterials;
        lVar17 = -1;
        if (0 < lVar14) {
          lVar15 = 0;
          do {
            lVar17 = lVar15;
            if ((this->matList).materials[lVar15] == pMVar4) break;
            lVar15 = lVar15 + 1;
            lVar17 = -1;
          } while (lVar14 != lVar15);
        }
        *(int32 *)(lVar10 + lVar17 * 4) = numMeshes;
        numMeshes = numMeshes + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  if (0 < (this->matList).numMaterials) {
    lVar17 = 0;
    do {
      Material::destroy((this->matList).materials[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (this->matList).numMaterials);
  }
  (*DAT_0014ada0)((this->matList).materials);
  (this->matList).materials = ppMVar8;
  (this->matList).space = (this->matList).numMaterials;
  (this->matList).numMaterials = numMeshes;
  this->meshHeader = (MeshHeader *)0x0;
  pMVar9 = allocateMeshes(this,numMeshes,pMVar3->totalIndices,0);
  pMVar9->flags = pMVar3->flags;
  pMVar16 = pMVar9 + 1;
  uVar7 = pMVar3->numMeshes;
  if (uVar7 != 0) {
    lVar17 = 0;
    pMVar13 = pMVar16;
    do {
      uVar1 = *(uint32 *)((long)&pMVar3[1].totalIndices + lVar17);
      if (uVar1 != 0) {
        pMVar13->totalIndices = uVar1;
        uVar5 = *(undefined8 *)((long)&pMVar3[2].flags + lVar17);
        pMVar13[1].flags = (int)uVar5;
        pMVar13[1].numMeshes = (short)((ulong)uVar5 >> 0x20);
        pMVar13[1].serialNum = (short)((ulong)uVar5 >> 0x30);
        pMVar13 = (MeshHeader *)&pMVar13[1].totalIndices;
      }
      lVar17 = lVar17 + 0x18;
    } while ((ulong)uVar7 * 0x18 != lVar17);
  }
  MeshHeader::setupIndices(pMVar9);
  uVar7 = pMVar3->numMeshes;
  if (uVar7 != 0) {
    uVar11 = 0;
    pMVar9 = pMVar3;
    do {
      uVar12 = (ulong)pMVar9[1].totalIndices;
      if (uVar12 != 0) {
        memcpy(*(void **)pMVar16,*(void **)(pMVar9 + 1),uVar12 * 2);
        pMVar16 = (MeshHeader *)&pMVar16[1].totalIndices;
        uVar7 = pMVar3->numMeshes;
      }
      uVar11 = uVar11 + 1;
      pMVar9 = (MeshHeader *)&pMVar9[1].totalIndices;
    } while (uVar11 < uVar7);
  }
  (*DAT_0014ada0)(pMVar3);
  iVar2 = this->numTriangles;
  if (0 < (long)iVar2) {
    pTVar6 = this->triangles;
    lVar17 = 0;
    do {
      pTVar6[lVar17].matId = *(uint16 *)(lVar10 + (ulong)pTVar6[lVar17].matId * 4);
      lVar17 = lVar17 + 1;
    } while (iVar2 != lVar17);
  }
  (*DAT_0014ada0)(lVar10);
  return;
}

Assistant:

void
Geometry::removeUnusedMaterials(void)
{
	if(this->meshHeader == nil)
		return;
	MeshHeader *mh = this->meshHeader;
	Mesh *m = mh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++)
		if(m[i].indices == nil)
			return;

	int32 *map = rwNewT(int32, this->matList.numMaterials,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	Material **materials = rwNewT(Material*,this->matList.numMaterials,
		MEMDUR_EVENT | ID_MATERIAL);
	int32 numMaterials = 0;
	/* Build new material list and map */
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		materials[numMaterials] = m[i].material;
		m[i].material->addRef();
		int32 oldid = this->matList.findIndex(m[i].material);
		map[oldid] = numMaterials;
		numMaterials++;
	}
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		this->matList.materials[i]->destroy();
	rwFree(this->matList.materials);
	this->matList.materials = materials;
	this->matList.space = this->matList.numMaterials;
	this->matList.numMaterials = numMaterials;

	/* Build new meshes */
	this->meshHeader = nil;
	MeshHeader *newmh = this->allocateMeshes(numMaterials, mh->totalIndices, 0);
	newmh->flags = mh->flags;
	Mesh *newm = newmh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		newm->numIndices = m[i].numIndices;
		newm->material = m[i].material;
		newm++;
	}
	newmh->setupIndices();
	/* Copy indices */
	newm = newmh->getMeshes();;
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		memcpy(newm->indices, m[i].indices,
		       m[i].numIndices*sizeof(*m[i].indices));
		newm++;
	}
	rwFree(mh);

	/* Remap triangle material IDs */
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = map[this->triangles[i].matId];
	rwFree(map);
}